

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O1

void __thiscall
FDrawInfo::DrawFloodedPlane(FDrawInfo *this,wallseg *ws,float planez,sector_t *sec,bool ceiling)

{
  FDynamicColormap *pFVar1;
  FFlatVertexBuffer *pFVar2;
  FMaterial *this_00;
  undefined7 in_register_00000009;
  int sectorlightlevel;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  FColormap Colormap;
  FQuadDrawer qd;
  GLSectorPlane plane;
  FColormap local_90;
  FQuadDrawer local_80;
  GLSectorPlane local_70;
  
  GLSectorPlane::GetFromSector(&local_70,sec,(int)CONCAT71(in_register_00000009,ceiling));
  this_00 = FMaterial::ValidateTexture(local_70.texture,false,true);
  if (this_00 == (FMaterial *)0x0) {
    return;
  }
  if (gl_fixedcolormap == 0) {
    pFVar1 = sec->ColorMap;
    local_90.LightColor.field_0 = (pFVar1->Color).field_0;
    local_90.FadeColor.field_0 = (pFVar1->Fade).field_0;
    local_90.blendfactor._0_1_ = (pFVar1->Color).field_0.field_0.a;
    local_90.desaturation = pFVar1->Desaturate;
    local_90.blendfactor._1_3_ = 0;
    if (((this_00->tex->gl_info).field_0x4c & 8) == 0) {
      if (ceiling) {
        iVar3 = sector_t::GetCeilingLight(sec);
      }
      else {
        iVar3 = sector_t::GetFloorLight(sec);
      }
      sectorlightlevel = -iVar3;
      if (0 < iVar3) {
        sectorlightlevel = iVar3;
      }
      goto LAB_0043bb65;
    }
    local_90.LightColor.field_0.d._0_3_ = 0xffffff;
  }
  else {
    local_90.LightColor.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0xffffff;
    local_90.FadeColor.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)0x0;
    local_90.desaturation = 0;
    local_90.blendfactor = 0;
  }
  sectorlightlevel = 0xff;
LAB_0043bb65:
  iVar3 = gl_weaponlight.Value * extralight;
  gl_SetColor(sectorlightlevel,iVar3,&local_90,1.0,false);
  gl_SetFog(sectorlightlevel,iVar3,&local_90,false);
  gl_RenderState.mEffectState = this_00->mShaderIndex;
  gl_RenderState.mShaderTimer = (this_00->tex->gl_info).shaderspeed;
  FMaterial::Bind(this_00,0,0);
  fVar4 = (float)ViewPos.X;
  fVar5 = (float)ViewPos.Y;
  fVar6 = (float)ViewPos.Z;
  gl_SetPlaneTextureRotation(&local_70,this_00);
  FRenderState::Apply(&gl_RenderState);
  iVar3 = gl.buffermethod;
  fVar14 = (planez - fVar6) / (ws->z1 - fVar6);
  fVar6 = (planez - fVar6) / (ws->z2 - fVar6);
  fVar9 = ws->x1 - fVar4;
  fVar10 = fVar9 * fVar14 + fVar4;
  fVar7 = ws->y1 - fVar5;
  fVar13 = fVar7 * fVar14 + fVar5;
  fVar9 = fVar6 * fVar9 + fVar4;
  fVar7 = fVar7 * fVar6 + fVar5;
  fVar8 = ws->x2 - fVar4;
  fVar12 = fVar8 * fVar6 + fVar4;
  fVar11 = ws->y2 - fVar5;
  fVar6 = fVar6 * fVar11 + fVar5;
  fVar4 = fVar8 * fVar14 + fVar4;
  fVar5 = fVar11 * fVar14 + fVar5;
  if (gl.buffermethod == 1) {
    local_80.p = FQuadDrawer::buffer;
  }
  else {
    pFVar2 = GLRenderer->mVBO;
    local_80.ndx = pFVar2->mCurIndex;
    pFVar2->mCurIndex = local_80.ndx + 4U;
    if (0x1e828b < local_80.ndx + 4U) {
      pFVar2->mCurIndex = pFVar2->mIndex;
    }
    local_80.p = pFVar2->map + (uint)local_80.ndx;
  }
  (local_80.p)->x = fVar10;
  (local_80.p)->z = planez;
  (local_80.p)->y = fVar13;
  (local_80.p)->u = fVar10 * 0.015625;
  (local_80.p)->v = fVar13 * -0.015625;
  local_80.p[1].x = fVar9;
  local_80.p[1].z = planez;
  local_80.p[1].y = fVar7;
  local_80.p[1].u = fVar9 * 0.015625;
  local_80.p[1].v = fVar7 * -0.015625;
  local_80.p[2].x = fVar12;
  local_80.p[2].z = planez;
  local_80.p[2].y = fVar6;
  local_80.p[2].u = fVar12 * 0.015625;
  local_80.p[2].v = fVar6 * -0.015625;
  local_80.p[3].x = fVar4;
  local_80.p[3].z = planez;
  local_80.p[3].y = fVar5;
  local_80.p[3].u = fVar4 * 0.015625;
  local_80.p[3].v = fVar5 * -0.015625;
  if (iVar3 == 1) {
    FQuadDrawer::DoRender(&local_80,6);
  }
  else {
    (*_ptrc_glDrawArrays)(6,local_80.ndx,4);
  }
  gl_RenderState.mTextureMatrixEnabled = false;
  return;
}

Assistant:

void FDrawInfo::DrawFloodedPlane(wallseg * ws, float planez, sector_t * sec, bool ceiling)
{
	GLSectorPlane plane;
	int lightlevel;
	FColormap Colormap;
	FMaterial * gltexture;

	plane.GetFromSector(sec, ceiling);

	gltexture=FMaterial::ValidateTexture(plane.texture, false, true);
	if (!gltexture) return;

	if (gl_fixedcolormap) 
	{
		Colormap.Clear();
		lightlevel=255;
	}
	else
	{
		Colormap=sec->ColorMap;
		if (gltexture->tex->isFullbright())
		{
			Colormap.LightColor.r = Colormap.LightColor.g = Colormap.LightColor.b = 0xff;
			lightlevel=255;
		}
		else lightlevel=abs(ceiling? sec->GetCeilingLight() : sec->GetFloorLight());
	}

	int rel = getExtraLight();
	gl_SetColor(lightlevel, rel, Colormap, 1.0f);
	gl_SetFog(lightlevel, rel, &Colormap, false);
	gl_RenderState.SetMaterial(gltexture, CLAMP_NONE, 0, -1, false);

	float fviewx = ViewPos.X;
	float fviewy = ViewPos.Y;
	float fviewz = ViewPos.Z;

	gl_SetPlaneTextureRotation(&plane, gltexture);
	gl_RenderState.Apply();

	float prj_fac1 = (planez-fviewz)/(ws->z1-fviewz);
	float prj_fac2 = (planez-fviewz)/(ws->z2-fviewz);

	float px1 = fviewx + prj_fac1 * (ws->x1-fviewx);
	float py1 = fviewy + prj_fac1 * (ws->y1-fviewy);

	float px2 = fviewx + prj_fac2 * (ws->x1-fviewx);
	float py2 = fviewy + prj_fac2 * (ws->y1-fviewy);

	float px3 = fviewx + prj_fac2 * (ws->x2-fviewx);
	float py3 = fviewy + prj_fac2 * (ws->y2-fviewy);

	float px4 = fviewx + prj_fac1 * (ws->x2-fviewx);
	float py4 = fviewy + prj_fac1 * (ws->y2-fviewy);

	FQuadDrawer qd;
	qd.Set(0, px1, planez, py1, px1 / 64, -py1 / 64);
	qd.Set(1, px2, planez, py2, px2 / 64, -py2 / 64);
	qd.Set(2, px3, planez, py3, px3 / 64, -py3 / 64);
	qd.Set(3, px4, planez, py4, px4 / 64, -py4 / 64);
	qd.Render(GL_TRIANGLE_FAN);

	gl_RenderState.EnableTextureMatrix(false);
}